

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArray<int,_false,_true>::TypedXor
          (TypedArray<int,_false,_true> *this,uint32 accessIndex,Var value)

{
  Type puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  int32 value_00;
  ArrayBufferBase *pAVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  ScriptContext *scriptContext_00;
  type result;
  type *buffer;
  ScriptContext *scriptContext;
  Var value_local;
  uint32 accessIndex_local;
  TypedArray<int,_false,_true> *this_local;
  Var local_10;
  
  pAVar6 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
  if (pAVar6 != (ArrayBufferBase *)0x0) {
    pAVar6 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
    iVar4 = (*(pAVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
    if (CONCAT44(extraout_var,iVar4) != 0) goto LAB_013a1ab0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                              ,0xafa,"(GetArrayBuffer() && GetArrayBuffer()->GetBuffer())",
                              "GetArrayBuffer() && GetArrayBuffer()->GetBuffer()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 0;
LAB_013a1ab0:
  uVar5 = ArrayObject::GetLength((ArrayObject *)this);
  if (uVar5 <= accessIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xafa,"(accessIndex < GetLength())","accessIndex < GetLength()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  puVar1 = (this->super_TypedArrayBase).buffer;
  value_00 = JavascriptConversion::ToInt32(value,scriptContext_00);
  iVar4 = AtomicsOperations::Xor<int>((int *)(puVar1 + (ulong)accessIndex * 4),value_00);
  bVar3 = TaggedInt::IsOverflow(iVar4);
  if (bVar3) {
    local_10 = JavascriptNumber::NewInlined((double)iVar4,scriptContext_00);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(iVar4);
  }
  return local_10;
}

Assistant:

VTableValue Int8Array::DummyVirtualFunctionToHinderLinkerICF()
    {
        return VTableValue::VtableInt8Array;
    }